

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkSubpassDescriptionDepthStencilResolve * __thiscall
Fossilize::StateRecorder::Impl::copy<VkSubpassDescriptionDepthStencilResolve>
          (Impl *this,VkSubpassDescriptionDepthStencilResolve *src,size_t count,
          ScratchAllocator *alloc)

{
  VkSubpassDescriptionDepthStencilResolve *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkSubpassDescriptionDepthStencilResolve>(alloc,count);
    if (pVVar1 != (VkSubpassDescriptionDepthStencilResolve *)0x0) {
      pVVar1 = (VkSubpassDescriptionDepthStencilResolve *)memmove(pVVar1,src,count << 5);
      return pVVar1;
    }
  }
  return (VkSubpassDescriptionDepthStencilResolve *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}